

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void constructor(LexState *ls,expdesc *t)

{
  byte bVar1;
  int where;
  FuncState *fs;
  int iVar2;
  ConsControl cc;
  ConsControl local_68;
  int local_34;
  
  fs = ls->fs;
  where = ls->linenumber;
  local_34 = luaK_codeABCk(fs,OP_NEWTABLE,0,0,0,0);
  luaK_code(fs,0);
  local_68.tostore = 0;
  local_68.nh = 0;
  local_68.na = 0;
  bVar1 = fs->freereg;
  t->t = -1;
  t->f = -1;
  t->k = VNONRELOC;
  *(uint *)&t->u = (uint)bVar1;
  local_68.t = t;
  luaK_reserveregs(fs,1);
  local_68.v.t = -1;
  local_68.v.f = -1;
  local_68.v.k = VVOID;
  local_68.v.u.info = 0;
  checknext(ls,0x7b);
  iVar2 = (ls->t).token;
  while (iVar2 != 0x7d) {
    if (local_68.v.k != VVOID) {
      luaK_exp2nextreg(fs,&local_68.v);
      local_68.v.k = VVOID;
      if (local_68.tostore == 0x32) {
        luaK_setlist(fs,((local_68.t)->u).info,local_68.na,0x32);
        local_68.na = local_68.na + local_68.tostore;
        local_68.tostore = 0;
      }
    }
    iVar2 = (ls->t).token;
    if ((iVar2 == 0x5b) || ((iVar2 == 0x123 && (iVar2 = luaX_lookahead(ls), iVar2 == 0x3d)))) {
      recfield(ls,&local_68);
    }
    else {
      subexpr(ls,&local_68.v,0);
      local_68.tostore = local_68.tostore + 1;
    }
    if (((ls->t).token != 0x2c) && ((ls->t).token != 0x3b)) break;
    luaX_next(ls);
    iVar2 = (ls->t).token;
  }
  check_match(ls,0x7d,0x7b,where);
  if (local_68.tostore != 0) {
    if (local_68.v.k - VCALL < 2) {
      luaK_setreturns(fs,&local_68.v,-1);
      luaK_setlist(fs,((local_68.t)->u).info,local_68.na,-1);
      local_68.na = local_68.na + -1;
    }
    else {
      if (local_68.v.k != VVOID) {
        luaK_exp2nextreg(fs,&local_68.v);
      }
      luaK_setlist(fs,((local_68.t)->u).info,local_68.na,local_68.tostore);
    }
    local_68.na = local_68.na + local_68.tostore;
  }
  luaK_settablesize(fs,local_34,(t->u).info,local_68.na,local_68.nh);
  return;
}

Assistant:

static void constructor (LexState *ls, expdesc *t) {
  /* constructor -> '{' [ field { sep field } [sep] ] '}'
     sep -> ',' | ';' */
  FuncState *fs = ls->fs;
  int line = ls->linenumber;
  int pc = luaK_codeABC(fs, OP_NEWTABLE, 0, 0, 0);
  ConsControl cc;
  luaK_code(fs, 0);  /* space for extra arg. */
  cc.na = cc.nh = cc.tostore = 0;
  cc.t = t;
  init_exp(t, VNONRELOC, fs->freereg);  /* table will be at stack top */
  luaK_reserveregs(fs, 1);
  init_exp(&cc.v, VVOID, 0);  /* no value (yet) */
  checknext(ls, '{');
  do {
    lua_assert(cc.v.k == VVOID || cc.tostore > 0);
    if (ls->t.token == '}') break;
    closelistfield(fs, &cc);
    field(ls, &cc);
  } while (testnext(ls, ',') || testnext(ls, ';'));
  check_match(ls, '}', '{', line);
  lastlistfield(fs, &cc);
  luaK_settablesize(fs, pc, t->u.info, cc.na, cc.nh);
}